

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragOpInteractionCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::FragOpInteractionCase::ReferenceContext::ReferenceContext
          (ReferenceContext *this,RenderContext *renderCtx,int width,int height)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  PixelFormat *colorBits;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  MultisamplePixelBufferAccess local_a8;
  MultisamplePixelBufferAccess local_80;
  MultisamplePixelBufferAccess local_58;
  int local_20;
  int local_1c;
  int height_local;
  int width_local;
  RenderContext *renderCtx_local;
  ReferenceContext *this_local;
  
  local_20 = height;
  local_1c = width;
  _height_local = renderCtx;
  renderCtx_local = (RenderContext *)this;
  sglr::ReferenceContextLimits::ReferenceContextLimits(&this->limits,renderCtx);
  iVar1 = (*_height_local->_vptr_RenderContext[4])();
  colorBits = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var,iVar1));
  iVar1 = (*_height_local->_vptr_RenderContext[4])();
  iVar1 = tcu::RenderTarget::getDepthBits((RenderTarget *)CONCAT44(extraout_var_00,iVar1));
  iVar2 = (*_height_local->_vptr_RenderContext[4])();
  iVar2 = tcu::RenderTarget::getStencilBits((RenderTarget *)CONCAT44(extraout_var_01,iVar2));
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            (&this->buffers,colorBits,iVar1,iVar2,local_1c,local_20,1);
  sglr::ReferenceContextBuffers::getColorbuffer(&local_58,&this->buffers);
  sglr::ReferenceContextBuffers::getDepthbuffer(&local_80,&this->buffers);
  sglr::ReferenceContextBuffers::getStencilbuffer(&local_a8,&this->buffers);
  sglr::ReferenceContext::ReferenceContext
            (&this->context,&this->limits,&local_58,&local_80,&local_a8);
  return;
}

Assistant:

ReferenceContext (glu::RenderContext& renderCtx, int width, int height)
		: limits	(renderCtx)
		, buffers	(renderCtx.getRenderTarget().getPixelFormat(), renderCtx.getRenderTarget().getDepthBits(), renderCtx.getRenderTarget().getStencilBits(), width, height)
		, context	(limits, buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer())
	{
	}